

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O2

SBuf * lj_strfmt_putfchar(SBuf *sb,SFormat sf,int32_t c)

{
  char *pcVar1;
  MSize sz;
  uint uVar2;
  
  uVar2 = sf >> 0x10 & 0xff;
  sz = uVar2 + (uVar2 == 0);
  pcVar1 = sb->w;
  if ((uint)(*(int *)&sb->e - (int)pcVar1) < sz) {
    pcVar1 = lj_buf_more2(sb,sz);
  }
  if ((sf >> 8 & 1) == 0) goto LAB_001163d3;
  *pcVar1 = (char)c;
  while( true ) {
    pcVar1 = pcVar1 + 1;
LAB_001163d3:
    if (uVar2 < 2) break;
    uVar2 = uVar2 - 1;
    *pcVar1 = ' ';
  }
  if ((sf >> 8 & 1) == 0) {
    *pcVar1 = (char)c;
    pcVar1 = pcVar1 + 1;
  }
  sb->w = pcVar1;
  return sb;
}

Assistant:

SBuf *lj_strfmt_putfchar(SBuf *sb, SFormat sf, int32_t c)
{
  MSize width = STRFMT_WIDTH(sf);
  char *w = lj_buf_more(sb, width > 1 ? width : 1);
  if ((sf & STRFMT_F_LEFT)) *w++ = (char)c;
  while (width-- > 1) *w++ = ' ';
  if (!(sf & STRFMT_F_LEFT)) *w++ = (char)c;
  sb->w = w;
  return sb;
}